

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverviewExamples.cpp
# Opt level: O0

Sandwich * createSandwichForTest(void)

{
  Sandwich *in_RDI;
  Sandwich *result;
  Sandwich *in_stack_fffffffffffffdf0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  string *local_1b0;
  string *local_168;
  allocator<char> local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  string *local_118;
  string local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  string *local_b0;
  undefined8 local_a8;
  undefined1 local_9c;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  string *local_98;
  string local_90 [32];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  string *local_30;
  undefined8 local_28;
  undefined1 local_9;
  
  local_9 = 0;
  Sandwich::Sandwich(in_stack_fffffffffffffdf0);
  std::__cxx11::string::operator=((string *)in_RDI,"Sourdough");
  local_9c = 1;
  local_98 = local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_98 = (string *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_98 = (string *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_9c = 0;
  local_30 = local_90;
  local_28 = 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffe08);
  local_168 = (string *)&local_30;
  do {
    local_168 = local_168 + -0x20;
    std::__cxx11::string::~string(local_168);
  } while (local_168 != local_90);
  std::allocator<char>::~allocator(&local_9b);
  std::allocator<char>::~allocator(&local_9a);
  std::allocator<char>::~allocator(&local_99);
  local_118 = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_118 = (string *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_118 = (string *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_b0 = local_110;
  local_a8 = 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffe08);
  local_1b0 = (string *)&local_b0;
  do {
    local_1b0 = local_1b0 + -0x20;
    std::__cxx11::string::~string(local_1b0);
  } while (local_1b0 != local_110);
  std::allocator<char>::~allocator(&local_11b);
  std::allocator<char>::~allocator(&local_11a);
  std::allocator<char>::~allocator(&local_119);
  return in_RDI;
}

Assistant:

static Sandwich createSandwichForTest()
{
    Sandwich result;
    result.bread = "Sourdough";
    result.condiments.contents = {"Mayo", "Pepper", "Olive Oil"};
    result.fillings.contents = {"Tomato", "Lettuce", "Cheddar"};
    return result;
}